

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat operator*(double value,Mat *Matrix)

{
  int iVar1;
  int iVar2;
  double *extraout_RDX;
  double *pdVar3;
  int *in_RSI;
  Mat MVar4;
  int local_2c;
  int i;
  int nEl;
  Mat *Matrix_local;
  double value_local;
  Mat *Aux;
  
  iVar1 = *in_RSI;
  iVar2 = in_RSI[1];
  Mat::Mat(Matrix,*in_RSI,in_RSI[1]);
  pdVar3 = extraout_RDX;
  for (local_2c = 0; local_2c < iVar1 * iVar2; local_2c = local_2c + 1) {
    pdVar3 = (double *)(long)local_2c;
    Matrix->v_[local_2c] = value * *(double *)(*(long *)(in_RSI + 2) + (long)pdVar3 * 8);
  }
  MVar4.v_ = pdVar3;
  MVar4._0_8_ = Matrix;
  return MVar4;
}

Assistant:

Mat operator*(double value, const Mat& Matrix)
{
	int nEl = Matrix.n_rows_*Matrix.n_cols_;
	Mat Aux(Matrix.n_rows_, Matrix.n_cols_);
	for (int i=0; i<nEl; i++) 	
		Aux.v_[i] = value*Matrix.v_[i];
	return Aux;
}